

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAdda<(moira::Instr)2,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)11,_4> src;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar4 & 0xffff | iVar3 << 0x10;
  cVar2 = 'a';
  lVar6 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar2;
    cVar2 = "adda"[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pcVar5 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar5 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar5 = '.';
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = 'l';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar3);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_3c);
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(An)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmAdda(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}